

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O2

void __thiscall
TldDSAsKey::TldDSAsKey(TldDSAsKey *this,char *name,size_t name_len,bool has_ds,uint32_t algo_code)

{
  uint8_t uVar1;
  size_t sVar2;
  undefined3 in_register_00000009;
  size_t sVar3;
  size_t sVar4;
  uint8_t uVar5;
  
  this->_vptr_TldDSAsKey = (_func_int **)&PTR__TldDSAsKey_001b49b0;
  this->HashNext = (TldDSAsKey *)0x0;
  this->ds_count = CONCAT31(in_register_00000009,has_ds);
  this->count = 1;
  this->hash = 0;
  sVar2 = 0x3f;
  if (name_len < 0x3f) {
    sVar2 = name_len;
  }
  for (sVar3 = 0; sVar4 = sVar2, sVar2 != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = name[sVar3];
    uVar5 = uVar1 + 0xe0;
    if (0x19 < (byte)(uVar1 + 0x9f)) {
      uVar5 = uVar1;
    }
    this->name[sVar3] = uVar5;
  }
  for (; sVar4 != 0x40; sVar4 = sVar4 + 1) {
    this->name[sVar4] = '\0';
  }
  this->name_len = sVar2;
  if (has_ds) {
    this->algo_code[0] = algo_code;
    this->algo_count[0] = 1;
  }
  this->algo_nb = (uint)has_ds;
  return;
}

Assistant:

TldDSAsKey::TldDSAsKey(const char * name, size_t name_len, bool has_ds, uint32_t algo_code)
    :
    HashNext(NULL),
    ds_count((has_ds)?1:0),
    count(1),
    hash(0)
{
    if (name_len > 63)
    {
        name_len = 63;
    }
    for (size_t i = 0; i < name_len; i++)
    {
        int c = name[i];
        if (c >= 'a' && c <= 'z')
        {
            c = c + 'A' - 'a';
        }
        this->name[i] = c;
    }

    for (size_t i = name_len; i < 64; i++)
    {
        this->name[i] = 0;
    }
    this->name_len = name_len;

    if (has_ds) {
        this->algo_nb = 1;
        this->algo_code[0] = algo_code;
        this->algo_count[0] = 1;
    }
    else {
        this->algo_nb = 0;
    }
}